

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dashel-common.cpp
# Opt level: O1

void __thiscall Dashel::ParameterSet::add(ParameterSet *this,char *line)

{
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar1;
  char *pcVar2;
  char *pcVar3;
  size_t sVar4;
  mapped_type *pmVar5;
  long lVar6;
  key_type local_80;
  ParameterSet *local_60;
  vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *local_58;
  pointer local_50;
  pointer local_48;
  char *local_40;
  char *local_38;
  
  local_40 = strdup(line);
  local_48 = (this->params).
             super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             ._M_impl.super__Vector_impl_data._M_start;
  local_50 = (this->params).
             super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             ._M_impl.super__Vector_impl_data._M_finish;
  local_60 = this;
  pcVar2 = strtok(local_40,":");
  if (pcVar2 != (char *)0x0) {
    pcVar2 = strtok((char *)0x0,";");
    if (pcVar2 != (char *)0x0) {
      local_58 = (vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)
                 &local_60->params;
      paVar1 = &local_80.field_2;
      lVar6 = 0;
      do {
        pcVar3 = strchr(pcVar2,0x3d);
        if (pcVar3 == (char *)0x0) {
          if (local_50 == local_48) {
            local_80._M_dataplus._M_p = (pointer)paVar1;
            sVar4 = strlen(pcVar2);
            std::__cxx11::string::_M_construct<char_const*>
                      ((string *)&local_80,pcVar2,pcVar2 + sVar4);
            std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
            emplace_back<std::__cxx11::string>(local_58,&local_80);
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)local_80._M_dataplus._M_p != paVar1) {
              operator_delete(local_80._M_dataplus._M_p,local_80.field_2._M_allocated_capacity + 1);
            }
          }
          pmVar5 = std::
                   map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                   ::operator[](&local_60->values,
                                (key_type *)
                                ((long)&(((local_60->params).
                                          super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                          ._M_impl.super__Vector_impl_data._M_start)->_M_dataplus).
                                        _M_p + lVar6));
          pcVar3 = (char *)pmVar5->_M_string_length;
          strlen(pcVar2);
          std::__cxx11::string::_M_replace((ulong)pmVar5,0,pcVar3,(ulong)pcVar2);
        }
        else {
          *pcVar3 = '\0';
          local_80._M_dataplus._M_p = (pointer)paVar1;
          sVar4 = strlen(pcVar2);
          std::__cxx11::string::_M_construct<char_const*>((string *)&local_80,pcVar2,pcVar2 + sVar4)
          ;
          pmVar5 = std::
                   map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                   ::operator[](&local_60->values,&local_80);
          local_38 = (char *)pmVar5->_M_string_length;
          strlen(pcVar3 + 1);
          std::__cxx11::string::_M_replace((ulong)pmVar5,0,local_38,(ulong)(pcVar3 + 1));
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_80._M_dataplus._M_p != paVar1) {
            operator_delete(local_80._M_dataplus._M_p,local_80.field_2._M_allocated_capacity + 1);
          }
          if (local_50 == local_48) {
            local_80._M_dataplus._M_p = (pointer)paVar1;
            sVar4 = strlen(pcVar2);
            std::__cxx11::string::_M_construct<char_const*>
                      ((string *)&local_80,pcVar2,pcVar2 + sVar4);
            std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
            emplace_back<std::__cxx11::string>(local_58,&local_80);
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)local_80._M_dataplus._M_p != paVar1) {
              operator_delete(local_80._M_dataplus._M_p,local_80.field_2._M_allocated_capacity + 1);
            }
          }
        }
        pcVar2 = strtok((char *)0x0,";");
        lVar6 = lVar6 + 0x20;
      } while (pcVar2 != (char *)0x0);
    }
    free(local_40);
    return;
  }
  __assert_fail("protocolName",
                "/workspace/llm4binary/github/license_all_cmakelists_1510/aseba-community[P]dashel/dashel/dashel-common.cpp"
                ,0xe8,"void Dashel::ParameterSet::add(const char *)");
}

Assistant:

void ParameterSet::add(const char* line)
	{
		char* lc = strdup(line);
		int spc = 0;
		char* param;
		bool storeParams = (params.size() == 0);
		char* protocolName = strtok(lc, ":");

		// Do nothing with this.
		assert(protocolName);

		while ((param = strtok(NULL, ";")) != NULL)
		{
			char* sep = strchr(param, '=');
			if (sep)
			{
				*sep++ = 0;
				values[param] = sep;
				if (storeParams)
					params.push_back(param);
			}
			else
			{
				if (storeParams)
					params.push_back(param);
				values[params[spc]] = param;
			}
			++spc;
		}

		free(lc);
	}